

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O2

void __thiscall SQArray::Append(SQArray *this,SQObject *o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr local_18;
  
  local_18.super_SQObject._type = o->_type;
  local_18.super_SQObject._unVal = (SQObjectValue)(o->_unVal).pTable;
  if ((local_18.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  sqvector<SQObjectPtr>::push_back(&this->_values,&local_18);
  SQObjectPtr::~SQObjectPtr(&local_18);
  return;
}

Assistant:

void Append(const SQObject &o){_values.push_back(o);}